

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O0

int __thiscall
sliding_puzzle::SlidingPuzzle::calculateLinearConflict
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *state)

{
  int iVar1;
  element_type *peVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  int local_3c;
  int local_38;
  int k_1;
  int k;
  int j;
  int i;
  int target_location_b [2];
  int target_location_a [2];
  int linear_conflict;
  SlidingPuzzleStatePtr *state_local;
  SlidingPuzzle *this_local;
  
  target_location_a[0] = 0;
  k = 0;
  do {
    peVar2 = std::
             __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)state);
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&peVar2->state_);
    if (sVar3 <= (ulong)(long)k) {
      return target_location_a[0];
    }
    k_1 = 0;
    while( true ) {
      peVar2 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar2->state_,(long)k);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
      if (sVar3 <= (ulong)(long)k_1) break;
      peVar2 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar2->state_,(long)k);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)k_1);
      local_38 = k;
      if (*pvVar5 == 0) {
LAB_00116ab9:
        while( true ) {
          local_38 = local_38 + 1;
          peVar2 = std::
                   __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)state);
          sVar3 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::size(&peVar2->state_);
          local_3c = k_1;
          if (sVar3 <= (ulong)(long)local_38) break;
          peVar2 = std::
                   __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)state);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&peVar2->state_,(long)local_38);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)k_1);
          iVar1 = (*pvVar5 + -1) / puzzle_size;
          peVar2 = std::
                   __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)state);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&peVar2->state_,(long)local_38);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)k_1);
          if (((target_location_b[1] == k_1) && ((*pvVar5 + -1) % puzzle_size == k_1)) &&
             (iVar1 < target_location_b[0])) {
            target_location_a[0] = target_location_a[0] + 1;
          }
        }
        while( true ) {
          local_3c = local_3c + 1;
          peVar2 = std::
                   __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)state);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&peVar2->state_,(long)k);
          sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
          if (sVar3 <= (ulong)(long)local_3c) break;
          peVar2 = std::
                   __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)state);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&peVar2->state_,(long)k);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_3c);
          iVar1 = (*pvVar5 + -1) / puzzle_size;
          peVar2 = std::
                   __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)state);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&peVar2->state_,(long)k);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_3c);
          if (((target_location_b[0] == k) && (iVar1 == k)) &&
             ((*pvVar5 + -1) % puzzle_size < target_location_b[1])) {
            target_location_a[0] = target_location_a[0] + 1;
          }
        }
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)state);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&peVar2->state_,(long)k);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)k_1);
        target_location_b[0] = (*pvVar5 + -1) / puzzle_size;
        peVar2 = std::
                 __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)state);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&peVar2->state_,(long)k);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)k_1);
        target_location_b[1] = (*pvVar5 + -1) % puzzle_size;
        if ((k != target_location_b[0]) || (k_1 != target_location_b[1])) goto LAB_00116ab9;
      }
      k_1 = k_1 + 1;
    }
    k = k + 1;
  } while( true );
}

Assistant:

int SlidingPuzzle::calculateLinearConflict(const SlidingPuzzleStatePtr& state)
{
  int linear_conflict = 0;

  int target_location_a[2];
  int target_location_b[2];
  for (int i=0; i<state->state_.size(); ++i)
  {
    for (int j=0; j<state->state_[i].size(); ++j)
    {

      if (state->state_[i][j] != 0)
      {
        target_location_a[0] = (state->state_[i][j]-1)/puzzle_size;
        target_location_a[1] = (state->state_[i][j]-1)%puzzle_size;

        if (i == target_location_a[0] &&
            j == target_location_a[1])
        {
          continue;
        }
      }

      for (int k=i+1; k<state->state_.size(); ++k)
      {
        target_location_b[0] = (state->state_[k][j]-1)/puzzle_size;
        target_location_b[1] = (state->state_[k][j]-1)%puzzle_size;

        if ((target_location_a[1] == j) &&
            (target_location_b[1] == j))
        {
          if (target_location_a[0] > target_location_b[0])
          {
            linear_conflict += 1;
          }
        }
      }

      for (int k=j+1; k<state->state_[i].size(); ++k)
      {
        target_location_b[0] = (state->state_[i][k]-1)/puzzle_size;
        target_location_b[1] = (state->state_[i][k]-1)%puzzle_size;

        if ((target_location_a[0] == i) &&
            (target_location_b[0] == i))
        {
          if (target_location_a[1] > target_location_b[1])
          {
            linear_conflict += 1;
          }
        }
      }

    }
  }
  return linear_conflict;

}